

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O1

int Import(WebPPicture *picture,uint8_t *rgb,int rgb_stride,int step,int swap_rb,int import_alpha)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint8_t *a_ptr;
  uint8_t *r_ptr;
  uint8_t *g_ptr;
  uint32_t *puVar4;
  uint8_t *b_ptr;
  int iVar5;
  
  iVar5 = -rgb_stride;
  if (0 < rgb_stride) {
    iVar5 = rgb_stride;
  }
  iVar1 = picture->width;
  iVar3 = 0;
  if ((int)((4 - (uint)(import_alpha == 0)) * iVar1) <= iVar5) {
    r_ptr = rgb + (ulong)(swap_rb != 0) * 2;
    g_ptr = rgb + 1;
    b_ptr = rgb + (ulong)(swap_rb == 0) * 2;
    if (picture->use_argb == 0) {
      a_ptr = (uint8_t *)0x0;
      if (import_alpha != 0) {
        a_ptr = rgb + 3;
      }
      iVar3 = ImportYUVAFromRGBA(r_ptr,g_ptr,b_ptr,a_ptr,step,rgb_stride,0.0,0,picture);
    }
    else {
      iVar5 = picture->height;
      iVar2 = WebPPictureAlloc(picture);
      iVar3 = 0;
      if (iVar2 != 0) {
        VP8LDspInit();
        WebPInitAlphaProcessing();
        if (import_alpha == 0) {
          if (iVar5 < 1) {
            return 1;
          }
          puVar4 = picture->argb;
          do {
            (*WebPPackRGB)(r_ptr,g_ptr,b_ptr,iVar1,step,puVar4);
            r_ptr = r_ptr + rgb_stride;
            g_ptr = g_ptr + rgb_stride;
            b_ptr = b_ptr + rgb_stride;
            puVar4 = puVar4 + picture->argb_stride;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        else {
          puVar4 = picture->argb;
          if (swap_rb == 0) {
            if (iVar5 < 1) {
              return 1;
            }
            do {
              (*VP8LConvertBGRAToRGBA)((uint32_t *)rgb,iVar1,(uint8_t *)puVar4);
              rgb = (uint8_t *)((long)rgb + (long)rgb_stride);
              puVar4 = puVar4 + picture->argb_stride;
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
          else {
            if (iVar5 < 1) {
              return 1;
            }
            do {
              memcpy(puVar4,rgb,(long)iVar1 << 2);
              rgb = rgb + rgb_stride;
              puVar4 = puVar4 + picture->argb_stride;
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
        }
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

static int Import(WebPPicture* const picture,
                  const uint8_t* rgb, int rgb_stride,
                  int step, int swap_rb, int import_alpha) {
  int y;
  // swap_rb -> b,g,r,a , !swap_rb -> r,g,b,a
  const uint8_t* r_ptr = rgb + (swap_rb ? 2 : 0);
  const uint8_t* g_ptr = rgb + 1;
  const uint8_t* b_ptr = rgb + (swap_rb ? 0 : 2);
  const int width = picture->width;
  const int height = picture->height;

  if (abs(rgb_stride) < (import_alpha ? 4 : 3) * width) return 0;

  if (!picture->use_argb) {
    const uint8_t* a_ptr = import_alpha ? rgb + 3 : NULL;
    return ImportYUVAFromRGBA(r_ptr, g_ptr, b_ptr, a_ptr, step, rgb_stride,
                              0.f /* no dithering */, 0, picture);
  }
  if (!WebPPictureAlloc(picture)) return 0;

  VP8LDspInit();
  WebPInitAlphaProcessing();

  if (import_alpha) {
    // dst[] byte order is {a,r,g,b} for big-endian, {b,g,r,a} for little endian
    uint32_t* dst = picture->argb;
    const int do_copy = (ALPHA_OFFSET == 3) && swap_rb;
    assert(step == 4);
    if (do_copy) {
      for (y = 0; y < height; ++y) {
        memcpy(dst, rgb, width * 4);
        rgb += rgb_stride;
        dst += picture->argb_stride;
      }
    } else {
      for (y = 0; y < height; ++y) {
#ifdef WORDS_BIGENDIAN
        // BGRA or RGBA input order.
        const uint8_t* a_ptr = rgb + 3;
        WebPPackARGB(a_ptr, r_ptr, g_ptr, b_ptr, width, dst);
        r_ptr += rgb_stride;
        g_ptr += rgb_stride;
        b_ptr += rgb_stride;
#else
        // RGBA input order. Need to swap R and B.
        VP8LConvertBGRAToRGBA((const uint32_t*)rgb, width, (uint8_t*)dst);
#endif
        rgb += rgb_stride;
        dst += picture->argb_stride;
      }
    }
  } else {
    uint32_t* dst = picture->argb;
    assert(step >= 3);
    for (y = 0; y < height; ++y) {
      WebPPackRGB(r_ptr, g_ptr, b_ptr, width, step, dst);
      r_ptr += rgb_stride;
      g_ptr += rgb_stride;
      b_ptr += rgb_stride;
      dst += picture->argb_stride;
    }
  }
  return 1;
}